

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::InnerProductParameter::MergePartialFromCodedStream
          (InnerProductParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  int length;
  uint32 uVar6;
  int byte_limit;
  FillerParameter *this_00;
  unsigned_long uVar7;
  pair<int,_int> pVar8;
  int64 iVar9;
  UnknownFieldSet *unknown_fields;
  char cVar10;
  uint tag;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
LAB_00411574:
  pbVar2 = input->buffer_;
  uVar6 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar6 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_00411598;
    input->buffer_ = pbVar2 + 1;
    uVar11 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_00411598:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar11 = 0;
    if (uVar6 - 1 < 0x7f) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar6 | uVar11;
  }
  tag = (uint)uVar11;
  if ((uVar11 & 0x100000000) == 0) goto switchD_0041160d_default;
  cVar10 = (char)uVar11;
  switch((uint)(uVar11 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar10 != '\b') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00411806;
      this->num_output_ = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar6 = 0;
LAB_00411806:
      iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
      this->num_output_ = (uint32)iVar9;
      if (iVar9 < 0) {
        return false;
      }
    }
    goto LAB_00411574;
  case 2:
    if (cVar10 == '\x10') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar7 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->bias_term_ = uVar7 != 0;
      goto LAB_00411574;
    }
    break;
  case 3:
    if (cVar10 != '\x1a') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this_00 = this->weight_filler_;
    if (this_00 == (FillerParameter *)0x0) {
      this_00 = (FillerParameter *)operator_new(0x40);
      FillerParameter::FillerParameter(this_00);
      this->weight_filler_ = this_00;
    }
LAB_004116d8:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
      input->buffer_ = puVar4 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar8 < 0) {
      return false;
    }
    bVar5 = FillerParameter::MergePartialFromCodedStream(this_00,input);
    if (!bVar5) {
      return false;
    }
    bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar8.first);
    goto joined_r0x0041179e;
  case 4:
    if (cVar10 == '\"') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->bias_filler_;
      if (this_00 == (FillerParameter *)0x0) {
        this_00 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(this_00);
        this->bias_filler_ = this_00;
      }
      goto LAB_004116d8;
    }
    break;
  case 5:
    if (cVar10 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar11 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_004117ec;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_004117ec:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar11 < 0) {
          return false;
        }
      }
      this->axis_ = (int32)uVar11;
      goto LAB_00411574;
    }
    break;
  case 6:
    if (cVar10 == '0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar7 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->transpose_ = uVar7 != 0;
      goto LAB_00411574;
    }
  }
switchD_0041160d_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
joined_r0x0041179e:
  if (!bVar5) {
    return false;
  }
  goto LAB_00411574;
}

Assistant:

bool InnerProductParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.InnerProductParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 num_output = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num_output();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &num_output_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool bias_term = 2 [default = true];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_bias_term();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &bias_term_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter weight_filler = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weight_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 axis = 5 [default = 1];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool transpose = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_transpose();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &transpose_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.InnerProductParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.InnerProductParameter)
  return false;
#undef DO_
}